

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecCore.c
# Opt level: O2

Vec_Int_t * Acec_CountRemap(Gia_Man_t *pAdd,Gia_Man_t *pBase)

{
  int iVar1;
  Vec_Int_t *p;
  Gia_Obj_t *pGVar2;
  Gia_Obj_t *pGVar3;
  uint uVar4;
  int iVar5;
  
  iVar5 = pAdd->nObjs;
  p = Vec_IntAlloc(iVar5);
  p->nSize = iVar5;
  if (p->pArray != (int *)0x0) {
    memset(p->pArray,0xff,(long)iVar5 << 2);
  }
  Gia_ManSetPhase(pAdd);
  iVar5 = 0;
  Vec_IntWriteEntry(p,0,0);
  while( true ) {
    if (pAdd->nObjs <= iVar5) {
      return p;
    }
    pGVar2 = Gia_ManObj(pAdd,iVar5);
    if (pGVar2 == (Gia_Obj_t *)0x0) break;
    uVar4 = ~*(uint *)pGVar2;
    if (((uVar4 & 0x9fffffff) == 0) || (-1 < (int)*(uint *)pGVar2 && (uVar4 & 0x1fffffff) != 0)) {
      iVar1 = Abc_Lit2Var(pGVar2->Value);
      pGVar3 = Gia_ManObj(pBase,iVar1);
      iVar1 = Abc_Lit2Var(pGVar3->Value);
      iVar1 = Abc_Var2Lit(iVar1,(uint)((ulong)*(undefined8 *)pGVar2 >> 0x3f));
      Vec_IntWriteEntry(p,iVar5,iVar1);
    }
    iVar5 = iVar5 + 1;
  }
  return p;
}

Assistant:

Vec_Int_t * Acec_CountRemap( Gia_Man_t * pAdd, Gia_Man_t * pBase )
{
    Gia_Obj_t * pObj; int i;
    Vec_Int_t * vMapNew = Vec_IntStartFull( Gia_ManObjNum(pAdd) );
    Gia_ManSetPhase( pAdd );
    Vec_IntWriteEntry( vMapNew, 0, 0 );
    Gia_ManForEachCand( pAdd, pObj, i )
    {
        int iObjBase = Abc_Lit2Var(pObj->Value);
        Gia_Obj_t * pObjBase = Gia_ManObj( pBase, iObjBase );
        int iObjRepr = Abc_Lit2Var(pObjBase->Value);
        Vec_IntWriteEntry( vMapNew, i, Abc_Var2Lit(iObjRepr, Gia_ObjPhase(pObj)) );
    }
    return vMapNew;
}